

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O2

void __thiscall DSaveMenu::DSaveMenu(DSaveMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  char *__src;
  int index;
  FSaveGameNode *local_18;
  
  DLoadSaveMenu::DLoadSaveMenu(&this->super_DLoadSaveMenu,parent,desc);
  (this->super_DLoadSaveMenu).super_DListMenu.super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_007bf798;
  (this->NewSaveNode).Filename.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->NewSaveNode).bNoDelete = false;
  __src = FStringTable::operator[](&GStrings,"NEWSAVE");
  strcpy((this->NewSaveNode).Title,__src);
  (this->NewSaveNode).bNoDelete = true;
  local_18 = &this->NewSaveNode;
  TArray<FSaveGameNode_*,_FSaveGameNode_*>::Insert(&DLoadSaveMenu::SaveGames,0,&local_18);
  (this->super_DLoadSaveMenu).TopItem = 0;
  index = DLoadSaveMenu::LastSaved + 1;
  (this->super_DLoadSaveMenu).Selected = index;
  DLoadSaveMenu::ExtractSaveData(&this->super_DLoadSaveMenu,index);
  return;
}

Assistant:

DSaveMenu::DSaveMenu(DMenu *parent, FListMenuDescriptor *desc)
: DLoadSaveMenu(parent, desc)
{
	strcpy (NewSaveNode.Title, GStrings["NEWSAVE"]);
	NewSaveNode.bNoDelete = true;
	SaveGames.Insert(0, &NewSaveNode);
	TopItem = 0;
	if (LastSaved == -1)
	{
		Selected = 0;
	}
	else
	{
		Selected = LastSaved + 1;
	}
	ExtractSaveData (Selected);
}